

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedString::GenerateAccessorDeclarations
          (RepeatedString *this,Printer *p)

{
  uint uVar1;
  int iVar2;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_98;
  pointer local_80;
  pointer local_78;
  undefined1 local_68 [16];
  char local_58 [8];
  char *pcStack_50;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  undefined8 local_30;
  char *local_28;
  
  uVar1 = *(uint *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x38) + 0x80);
  iVar2 = google::protobuf::FieldDescriptor::cpp_string_type();
  if (uVar1 != (iVar2 == 2)) {
    google::protobuf::io::Printer::Emit(p,0,0,0x3c);
  }
  local_58[0] = '\n';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  pcStack_50 = "_internal_";
  local_68._0_8_ = 0;
  local_68._8_8_ = "";
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&local_80,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_68,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(2),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = ((long)local_78 - (long)local_80 >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = local_80;
  io::Printer::WithDefs(&local_48,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_80);
  local_58[0] = '\x04';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  pcStack_50 = "add_";
  local_68._0_8_ = 4;
  local_68._8_8_ = "set_";
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x2;
  AnnotatedAccessors(&local_98,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_68,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_00.len_ = ((long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = local_98.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)&local_80,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_98);
  local_30 = 8;
  local_28 = "mutable_";
  prefixes_00.len_ = 0x100000002;
  prefixes_00.ptr_ = (pointer)0x1;
  AnnotatedAccessors(&local_98,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_30,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_01.len_ = ((long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
  vars_01.ptr_ = local_98.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_68,p,vars_01,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_98);
  google::protobuf::io::Printer::Emit
            (p,0,0,0x2f5,
             "\n    $DEPRECATED$ const std::string& $name$(int index) const;\n    $DEPRECATED$ std::string* $mutable_name$(int index);\n    template <typename Arg_ = const std::string&, typename... Args_>\n    $DEPRECATED$ void set_$name$(int index, Arg_&& value, Args_... args);\n    $DEPRECATED$ std::string* $add_name$();\n    template <typename Arg_ = const std::string&, typename... Args_>\n    $DEPRECATED$ void $add_name$(Arg_&& value, Args_... args);\n    $DEPRECATED$ const $pb$::RepeatedPtrField<std::string>& $name$() const;\n    $DEPRECATED$ $pb$::RepeatedPtrField<std::string>* $mutable_name$();\n\n    private:\n    const $pb$::RepeatedPtrField<std::string>& _internal_$name$() const;\n    $pb$::RepeatedPtrField<std::string>* _internal_mutable_$name$();\n\n    public:\n  "
            );
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)local_68);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
              *)&local_80);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_48);
  return;
}

Assistant:

void RepeatedString::GenerateAccessorDeclarations(io::Printer* p) const {
  bool unknown_ctype =
      field_->options().ctype() != internal::cpp::EffectiveStringCType(field_);

  if (unknown_ctype) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto v1 = p->WithVars(AnnotatedAccessors(field_, {"", "_internal_"}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_", "add_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit(R"cc(
    $DEPRECATED$ const std::string& $name$(int index) const;
    $DEPRECATED$ std::string* $mutable_name$(int index);
    template <typename Arg_ = const std::string&, typename... Args_>
    $DEPRECATED$ void set_$name$(int index, Arg_&& value, Args_... args);
    $DEPRECATED$ std::string* $add_name$();
    template <typename Arg_ = const std::string&, typename... Args_>
    $DEPRECATED$ void $add_name$(Arg_&& value, Args_... args);
    $DEPRECATED$ const $pb$::RepeatedPtrField<std::string>& $name$() const;
    $DEPRECATED$ $pb$::RepeatedPtrField<std::string>* $mutable_name$();

    private:
    const $pb$::RepeatedPtrField<std::string>& _internal_$name$() const;
    $pb$::RepeatedPtrField<std::string>* _internal_mutable_$name$();

    public:
  )cc");
}